

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode Curl_auth_create_digest_md5_message
                   (Curl_easy *data,bufref *chlg,char *userp,char *passwdp,char *service,bufref *out
                   )

{
  undefined8 ptr;
  int iVar1;
  uint uVar2;
  MD5_context *pMVar3;
  size_t sVar4;
  uchar *data_00;
  CURLcode result;
  char *spn;
  undefined1 local_27f;
  uchar auStack_27e [3];
  char qop [5];
  char method [13];
  char nonceCount [9];
  char cnonce [33];
  uint local_23c;
  char local_238 [4];
  int qop_values;
  char qop_options [64];
  char algorithm [64];
  char realm [128];
  char nonce [64];
  char resp_hash_hex [33];
  uchar local_c8 [8];
  char HA2_hex [33];
  uchar local_98 [8];
  char HA1_hex [33];
  byte local_68 [8];
  uchar digest [16];
  char *response;
  MD5_context *ctxt;
  size_t i;
  bufref *out_local;
  char *service_local;
  char *passwdp_local;
  char *userp_local;
  bufref *chlg_local;
  Curl_easy *data_local;
  
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  builtin_strncpy(method + 5,"00000001",8);
  nonceCount[0] = '\0';
  _auStack_27e = 0x49544e4548545541;
  builtin_strncpy(method,"CATE",5);
  stack0xfffffffffffffd7d = 0x68747561;
  local_27f = 0;
  data_local._4_4_ =
       auth_decode_digest_md5_message
                 (chlg,realm + 0x78,0x40,algorithm + 0x38,0x80,qop_options + 0x38,0x40,local_238,
                  0x40);
  if (data_local._4_4_ == CURLE_OK) {
    iVar1 = strcmp(qop_options + 0x38,"md5-sess");
    if (iVar1 == 0) {
      data_local._4_4_ = auth_digest_get_qop_values(local_238,(int *)&local_23c);
      if (data_local._4_4_ == CURLE_OK) {
        if ((local_23c & 1) == 0) {
          data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
        }
        else {
          data_local._4_4_ = Curl_rand_hex(data,(uchar *)(nonceCount + 1),0x21);
          if (data_local._4_4_ == CURLE_OK) {
            pMVar3 = Curl_MD5_init(&Curl_DIGEST_MD5);
            if (pMVar3 == (MD5_context *)0x0) {
              data_local._4_4_ = CURLE_OUT_OF_MEMORY;
            }
            else {
              sVar4 = strlen(userp);
              uVar2 = curlx_uztoui(sVar4);
              Curl_MD5_update(pMVar3,(uchar *)userp,uVar2);
              Curl_MD5_update(pMVar3,":",1);
              sVar4 = strlen(algorithm + 0x38);
              uVar2 = curlx_uztoui(sVar4);
              Curl_MD5_update(pMVar3,(uchar *)(algorithm + 0x38),uVar2);
              Curl_MD5_update(pMVar3,":",1);
              sVar4 = strlen(passwdp);
              uVar2 = curlx_uztoui(sVar4);
              Curl_MD5_update(pMVar3,(uchar *)passwdp,uVar2);
              Curl_MD5_final(pMVar3,local_68);
              pMVar3 = Curl_MD5_init(&Curl_DIGEST_MD5);
              if (pMVar3 == (MD5_context *)0x0) {
                data_local._4_4_ = CURLE_OUT_OF_MEMORY;
              }
              else {
                Curl_MD5_update(pMVar3,local_68,0x10);
                Curl_MD5_update(pMVar3,":",1);
                sVar4 = strlen(realm + 0x78);
                uVar2 = curlx_uztoui(sVar4);
                Curl_MD5_update(pMVar3,(uchar *)(realm + 0x78),uVar2);
                Curl_MD5_update(pMVar3,":",1);
                sVar4 = strlen(nonceCount + 1);
                uVar2 = curlx_uztoui(sVar4);
                Curl_MD5_update(pMVar3,(uchar *)(nonceCount + 1),uVar2);
                Curl_MD5_final(pMVar3,local_68);
                for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                    ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                  curl_msnprintf((char *)(local_98 + (long)ctxt * 2),3,"%02x",
                                 (ulong)local_68[(long)ctxt]);
                }
                data_00 = (uchar *)Curl_auth_build_spn(service,(data->conn->host).name,(char *)0x0);
                if (data_00 == (uchar *)0x0) {
                  data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                }
                else {
                  pMVar3 = Curl_MD5_init(&Curl_DIGEST_MD5);
                  if (pMVar3 == (MD5_context *)0x0) {
                    (*Curl_cfree)(data_00);
                    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                  }
                  else {
                    sVar4 = strlen((char *)auStack_27e);
                    uVar2 = curlx_uztoui(sVar4);
                    Curl_MD5_update(pMVar3,auStack_27e,uVar2);
                    Curl_MD5_update(pMVar3,":",1);
                    sVar4 = strlen((char *)data_00);
                    uVar2 = curlx_uztoui(sVar4);
                    Curl_MD5_update(pMVar3,data_00,uVar2);
                    Curl_MD5_final(pMVar3,local_68);
                    for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                        ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                      curl_msnprintf((char *)(local_c8 + (long)ctxt * 2),3,"%02x",
                                     (ulong)local_68[(long)ctxt]);
                    }
                    pMVar3 = Curl_MD5_init(&Curl_DIGEST_MD5);
                    if (pMVar3 == (MD5_context *)0x0) {
                      (*Curl_cfree)(data_00);
                      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                    }
                    else {
                      Curl_MD5_update(pMVar3,local_98,0x20);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen(realm + 0x78);
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)(realm + 0x78),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen(method + 5);
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)(method + 5),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen(nonceCount + 1);
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)(nonceCount + 1),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      sVar4 = strlen((char *)((long)&spn + 5));
                      uVar2 = curlx_uztoui(sVar4);
                      Curl_MD5_update(pMVar3,(uchar *)((long)&spn + 5),uVar2);
                      Curl_MD5_update(pMVar3,":",1);
                      Curl_MD5_update(pMVar3,local_c8,0x20);
                      Curl_MD5_final(pMVar3,local_68);
                      for (ctxt = (MD5_context *)0x0; ctxt < (MD5_context *)0x10;
                          ctxt = (MD5_context *)((long)&ctxt->md5_hash + 1)) {
                        curl_msnprintf(resp_hash_hex + (long)ctxt * 2 + -8,3,"%02x",
                                       (ulong)local_68[(long)ctxt]);
                      }
                      digest._8_8_ = curl_maprintf(
                                                  "username=\"%s\",realm=\"%s\",nonce=\"%s\",cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,qop=%s"
                                                  ,userp,algorithm + 0x38,realm + 0x78,
                                                  nonceCount + 1,method + 5,data_00,nonce + 0x38,
                                                  (long)&spn + 5);
                      (*Curl_cfree)(data_00);
                      ptr = digest._8_8_;
                      if (digest._8_8_ == 0) {
                        data_local._4_4_ = CURLE_OUT_OF_MEMORY;
                      }
                      else {
                        sVar4 = strlen((char *)digest._8_8_);
                        Curl_bufref_set(out,(void *)ptr,sVar4,curl_free);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_auth_create_digest_md5_message(struct Curl_easy *data,
                                             const struct bufref *chlg,
                                             const char *userp,
                                             const char *passwdp,
                                             const char *service,
                                             struct bufref *out)
{
  size_t i;
  struct MD5_context *ctxt;
  char *response = NULL;
  unsigned char digest[MD5_DIGEST_LEN];
  char HA1_hex[2 * MD5_DIGEST_LEN + 1];
  char HA2_hex[2 * MD5_DIGEST_LEN + 1];
  char resp_hash_hex[2 * MD5_DIGEST_LEN + 1];
  char nonce[64];
  char realm[128];
  char algorithm[64];
  char qop_options[64];
  int qop_values;
  char cnonce[33];
  char nonceCount[] = "00000001";
  char method[]     = "AUTHENTICATE";
  char qop[]        = DIGEST_QOP_VALUE_STRING_AUTH;
  char *spn         = NULL;

  /* Decode the challenge message */
  CURLcode result = auth_decode_digest_md5_message(chlg,
                                                   nonce, sizeof(nonce),
                                                   realm, sizeof(realm),
                                                   algorithm,
                                                   sizeof(algorithm),
                                                   qop_options,
                                                   sizeof(qop_options));
  if(result)
    return result;

  /* We only support md5 sessions */
  if(strcmp(algorithm, "md5-sess") != 0)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Get the qop-values from the qop-options */
  result = auth_digest_get_qop_values(qop_options, &qop_values);
  if(result)
    return result;

  /* We only support auth quality-of-protection */
  if(!(qop_values & DIGEST_QOP_VALUE_AUTH))
    return CURLE_BAD_CONTENT_ENCODING;

  /* Generate 32 random hex chars, 32 bytes + 1 null-termination */
  result = Curl_rand_hex(data, (unsigned char *)cnonce, sizeof(cnonce));
  if(result)
    return result;

  /* So far so good, now calculate A1 and H(A1) according to RFC 2831 */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) userp,
                  curlx_uztoui(strlen(userp)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) realm,
                  curlx_uztoui(strlen(realm)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) passwdp,
                  curlx_uztoui(strlen(passwdp)));
  Curl_MD5_final(ctxt, digest);

  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) digest, MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_final(ctxt, digest);

  /* Convert calculated 16 octet hex into 32 bytes string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA1_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate our SPN */
  spn = Curl_auth_build_spn(service, data->conn->host.name, NULL);
  if(!spn)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate H(A2) */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) method,
                  curlx_uztoui(strlen(method)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) spn,
                  curlx_uztoui(strlen(spn)));
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&HA2_hex[2 * i], 3, "%02x", digest[i]);

  /* Now calculate the response hash */
  ctxt = Curl_MD5_init(&Curl_DIGEST_MD5);
  if(!ctxt) {
    free(spn);

    return CURLE_OUT_OF_MEMORY;
  }

  Curl_MD5_update(ctxt, (const unsigned char *) HA1_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) nonce,
                  curlx_uztoui(strlen(nonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) nonceCount,
                  curlx_uztoui(strlen(nonceCount)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) cnonce,
                  curlx_uztoui(strlen(cnonce)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);
  Curl_MD5_update(ctxt, (const unsigned char *) qop,
                  curlx_uztoui(strlen(qop)));
  Curl_MD5_update(ctxt, (const unsigned char *) ":", 1);

  Curl_MD5_update(ctxt, (const unsigned char *) HA2_hex, 2 * MD5_DIGEST_LEN);
  Curl_MD5_final(ctxt, digest);

  for(i = 0; i < MD5_DIGEST_LEN; i++)
    msnprintf(&resp_hash_hex[2 * i], 3, "%02x", digest[i]);

  /* Generate the response */
  response = aprintf("username=\"%s\",realm=\"%s\",nonce=\"%s\","
                     "cnonce=\"%s\",nc=\"%s\",digest-uri=\"%s\",response=%s,"
                     "qop=%s",
                     userp, realm, nonce,
                     cnonce, nonceCount, spn, resp_hash_hex, qop);
  free(spn);
  if(!response)
    return CURLE_OUT_OF_MEMORY;

  /* Return the response. */
  Curl_bufref_set(out, response, strlen(response), curl_free);
  return result;
}